

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_sectors.cpp
# Opt level: O2

void CheckShortestTex(FTextureID texnum,double *minsize)

{
  int iVar1;
  
  if (texnum.texnum < 1) {
    if (texnum.texnum != 0) {
      return;
    }
    if (((byte)i_compatflags & 1) == 0) {
      return;
    }
    if (TexMan.Textures.Count == 0) {
      return;
    }
  }
  else if (TexMan.Textures.Count <= (uint)texnum.texnum) {
    return;
  }
  if (TexMan.Textures.Array[(uint)texnum.texnum].Texture != (FTexture *)0x0) {
    iVar1 = FTexture::GetScaledHeight(TexMan.Textures.Array[(uint)texnum.texnum].Texture);
    if ((double)iVar1 < *minsize) {
      *minsize = (double)iVar1;
    }
  }
  return;
}

Assistant:

static inline void CheckShortestTex (FTextureID texnum, double &minsize)
{
	if (texnum.isValid() || (texnum.isNull() && (i_compatflags & COMPATF_SHORTTEX)))
	{
		FTexture *tex = TexMan[texnum];
		if (tex != NULL)
		{
			double h = tex->GetScaledHeight();
			if (h < minsize)
			{
				minsize = h;
			}
		}
	}
}